

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB_STL_utils.cpp
# Opt level: O3

void __thiscall
amrex::STLtools::fillFab
          (STLtools *this,BaseFab<double> *levelset,Geometry *geom,RunOn param_3,Box *param_4)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  pointer pTVar15;
  double *pdVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  double dVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  double dVar25;
  double dVar26;
  undefined1 auVar27 [16];
  double dVar28;
  double dVar29;
  pointer pTVar30;
  int iVar31;
  XDim3 *pXVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  int iVar36;
  long lVar37;
  int iVar38;
  long lVar39;
  long lVar40;
  byte bVar41;
  double *pdVar42;
  double *pdVar43;
  undefined4 in_R11D;
  int iVar44;
  undefined3 uVar45;
  byte bVar46;
  bool bVar47;
  uint uVar55;
  double dVar48;
  double dVar49;
  double dVar50;
  double dVar51;
  double dVar52;
  double dVar53;
  double dVar54;
  uint uVar59;
  double dVar56;
  double dVar57;
  double dVar58;
  double dVar60;
  double dVar61;
  double dVar64;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  double dVar62;
  double dVar63;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  double dVar69;
  double dVar70;
  double dVar71;
  double dVar72;
  undefined1 auVar73 [16];
  double dVar74;
  double dVar75;
  double dVar76;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  double dVar80;
  double dVar81;
  double dVar82;
  double dVar83;
  double dVar84;
  double dVar85;
  double dVar86;
  double dVar87;
  double dVar88;
  double dVar89;
  double dVar90;
  double dVar91;
  double dVar92;
  double dVar93;
  double dVar94;
  double dVar95;
  double dVar96;
  double dVar97;
  double dVar98;
  double dVar99;
  double dStack_420;
  double dStack_340;
  double dStack_330;
  double dStack_2d0;
  double dStack_2b0;
  double dStack_290;
  double dStack_280;
  double dStack_270;
  double dStack_200;
  double adStack_108 [6];
  double local_d8;
  double dStack_d0;
  double local_c8;
  double local_c0;
  double dStack_b8;
  double local_b0;
  double local_a8;
  double dStack_a0;
  double local_98;
  undefined4 local_40;
  uint uStack_3c;
  undefined4 uStack_38;
  uint uStack_34;
  
  uVar8 = this->m_num_tri;
  dVar1 = (geom->prob_domain).xlo[0];
  dVar2 = (geom->prob_domain).xlo[1];
  dVar3 = (geom->prob_domain).xlo[2];
  dVar4 = (geom->super_CoordSys).dx[0];
  dVar5 = (geom->super_CoordSys).dx[1];
  dVar6 = (geom->super_CoordSys).dx[2];
  pTVar15 = (this->m_tri_pts_d).m_data;
  local_c8 = (this->m_ptmin).z;
  local_d8 = (this->m_ptmin).x;
  dStack_d0 = (this->m_ptmin).y;
  local_b0 = (this->m_ptmax).z;
  local_c0 = (this->m_ptmax).x;
  dStack_b8 = (this->m_ptmax).y;
  local_a8 = (this->m_ptref).x;
  dStack_a0 = (this->m_ptref).y;
  local_98 = (this->m_ptref).z;
  pdVar16 = levelset->dptr;
  iVar9 = (levelset->domain).smallend.vect[0];
  lVar35 = (long)iVar9;
  iVar10 = (levelset->domain).smallend.vect[1];
  lVar33 = (long)iVar10;
  iVar11 = (levelset->domain).smallend.vect[2];
  iVar12 = (levelset->domain).bigend.vect[0];
  iVar13 = (levelset->domain).bigend.vect[1];
  uVar55 = (uint)((long)((ulong)*(uint *)&this->m_boundry_is_outside << 0x3f) >> 0x3f);
  uVar59 = (uint)((long)((ulong)*(uint *)&this->m_boundry_is_outside << 0x3f) >> 0x3f);
  iVar14 = (levelset->domain).bigend.vect[2];
  local_40 = 0;
  uStack_3c = uVar55 & 0xbff00000 | ~uVar55 & 0x3ff00000;
  uStack_38 = 0;
  uStack_34 = uVar59 & 0x3ff00000 | ~uVar59 & 0xbff00000;
  if (iVar11 <= iVar14) {
    iVar38 = iVar12 + 1;
    iVar36 = iVar13 + 1;
    lVar34 = iVar38 - lVar35;
    dVar90 = (double)((ulong)dStack_a0 ^ (ulong)DAT_0074fb00);
    dVar25 = (double)((ulong)DAT_0074fb00 ^ (ulong)local_98);
    auVar22._8_4_ = SUB84(dStack_a0,0);
    auVar22._0_8_ = dVar25;
    auVar22._12_4_ = (int)((ulong)dStack_a0 >> 0x20);
    auVar20._8_4_ = SUB84(local_98,0);
    auVar20._0_8_ = local_98;
    auVar20._12_4_ = (int)((ulong)local_98 >> 0x20);
    iVar31 = iVar11;
    do {
      if (iVar10 <= iVar13) {
        dVar21 = (double)iVar31 * dVar6 + dVar3;
        dVar60 = dVar21;
        if (dVar21 <= local_98) {
          dVar60 = local_98;
        }
        dVar61 = dVar21;
        if (local_98 <= dVar21) {
          dVar61 = local_98;
        }
        dVar48 = local_98 - dVar21;
        auVar65._0_8_ = -dVar21;
        auVar23._8_4_ = SUB84(dVar21,0);
        auVar23._0_8_ = dVar21;
        auVar23._12_4_ = (int)((ulong)dVar21 >> 0x20);
        auVar65._8_4_ = SUB84(dVar21,0);
        auVar65._12_4_ = (int)((ulong)auVar65._0_8_ >> 0x20);
        lVar40 = lVar33;
        do {
          if (iVar9 <= iVar12) {
            dVar26 = (double)(int)lVar40 * dVar5 + dVar2;
            dVar91 = dVar26;
            if (dVar26 <= dStack_a0) {
              dVar91 = dStack_a0;
            }
            dVar49 = dVar26;
            if (dStack_a0 <= dVar26) {
              dVar49 = dStack_a0;
            }
            dVar28 = dStack_a0 * dVar21 + dVar26 * dVar25;
            dVar50 = dVar26 - dStack_a0;
            auVar66._0_8_ = -dVar26;
            auVar24._8_4_ = SUB84(dVar26,0);
            auVar24._0_8_ = dVar26;
            auVar24._12_4_ = (int)((ulong)dVar26 >> 0x20);
            auVar66._8_4_ = SUB84(dVar26,0);
            auVar66._12_4_ = (int)((ulong)auVar66._0_8_ >> 0x20);
            auVar27._8_4_ = SUB84(dVar28,0);
            auVar27._0_8_ = dVar28;
            auVar27._12_4_ = (int)((ulong)dVar28 >> 0x20);
            lVar39 = lVar35;
            do {
              in_R11D = CONCAT31((int3)((uint)in_R11D >> 8),dVar21 < local_c8);
              dVar29 = (double)(int)lVar39 * dVar4 + dVar1;
              lVar37 = 200;
              if (((((dStack_d0 <= dVar26 && dVar26 <= dStack_b8) && dVar21 >= local_c8) &&
                   dVar21 <= local_b0) && 0 < (int)uVar8) &&
                  (local_d8 <= dVar29 && dVar29 <= local_c0)) {
                dVar99 = dVar29;
                if (dVar29 <= local_a8) {
                  dVar99 = local_a8;
                }
                dVar51 = dVar29;
                if (local_a8 <= dVar29) {
                  dVar51 = local_a8;
                }
                dVar71 = local_a8 * dVar26 + dVar29 * dVar90;
                dVar82 = local_a8 * dVar21 + dVar29 * dVar25;
                dVar69 = local_a8 - dVar29;
                lVar37 = 0;
                uVar55 = 0;
                do {
                  dVar64 = *(double *)((long)&(pTVar15->v1).x + lVar37);
                  dVar75 = *(double *)((long)&(pTVar15->v2).x + lVar37);
                  dVar70 = *(double *)((long)&(pTVar15->v3).x + lVar37);
                  dVar76 = dVar75;
                  if (dVar64 <= dVar75) {
                    dVar76 = dVar64;
                  }
                  dVar80 = dVar70;
                  if (dVar76 <= dVar70) {
                    dVar80 = dVar76;
                  }
                  if (dVar80 <= dVar99) {
                    dVar76 = dVar75;
                    pTVar30 = (pointer)&pTVar15->v2;
                    if (dVar75 <= dVar64) {
                      dVar76 = dVar64;
                      pTVar30 = pTVar15;
                    }
                    if (dVar76 < dVar70) {
                      pTVar30 = (pointer)&pTVar15->v3;
                    }
                    pdVar42 = (double *)((long)&(pTVar30->v1).x + lVar37);
                    if (dVar51 < *pdVar42 || dVar51 == *pdVar42) {
                      dVar76 = *(double *)((long)&(pTVar15->v1).y + lVar37);
                      dVar80 = *(double *)((long)&(pTVar15->v2).y + lVar37);
                      dVar98 = *(double *)((long)&(pTVar15->v3).y + lVar37);
                      dVar62 = dVar80;
                      if (dVar76 <= dVar80) {
                        dVar62 = dVar76;
                      }
                      dVar89 = dVar98;
                      if (dVar62 <= dVar98) {
                        dVar89 = dVar62;
                      }
                      if (dVar89 <= dVar91) {
                        dVar62 = dVar80;
                        pXVar32 = &pTVar15->v2;
                        if (dVar80 <= dVar76) {
                          dVar62 = dVar76;
                          pXVar32 = &pTVar15->v1;
                        }
                        if (dVar62 < dVar98) {
                          pXVar32 = &pTVar15->v3;
                        }
                        pdVar42 = (double *)((long)&pXVar32->y + lVar37);
                        if (dVar49 < *pdVar42 || dVar49 == *pdVar42) {
                          dVar62 = *(double *)((long)&(pTVar15->v1).z + lVar37);
                          dVar89 = *(double *)((long)&(pTVar15->v2).z + lVar37);
                          dVar7 = *(double *)((long)&(pTVar15->v3).z + lVar37);
                          dVar63 = dVar89;
                          if (dVar62 <= dVar89) {
                            dVar63 = dVar62;
                          }
                          dVar72 = dVar7;
                          if (dVar63 <= dVar7) {
                            dVar72 = dVar63;
                          }
                          if (dVar72 <= dVar60) {
                            dVar63 = dVar89;
                            pXVar32 = &pTVar15->v2;
                            if (dVar89 <= dVar62) {
                              dVar63 = dVar62;
                              pXVar32 = &pTVar15->v1;
                            }
                            pdVar42 = (double *)((long)&(pTVar15->v3).z + lVar37);
                            pdVar43 = (double *)((long)&pXVar32->z + lVar37);
                            if (dVar63 < dVar7) {
                              pdVar43 = pdVar42;
                            }
                            if (dVar61 < *pdVar43 || dVar61 == *pdVar43) {
                              dVar56 = dVar75 - dVar70;
                              dVar57 = dVar89 - dVar7;
                              dVar92 = dVar80 - dVar76;
                              dVar95 = dVar76 - dVar98;
                              dVar52 = dVar98 - dVar80;
                              dVar53 = dVar70 * dVar76 - dVar64 * dVar98;
                              dVar54 = dVar70 * dVar62 - dVar64 * dVar7;
                              dVar81 = dVar98 * dVar62 - dVar76 * dVar7;
                              dVar58 = dVar75 * dVar98 - dVar70 * dVar80;
                              auVar68._8_4_ = SUB84(dVar75,0);
                              auVar68._0_8_ = dVar64;
                              auVar68._12_4_ = (int)((ulong)dVar75 >> 0x20);
                              dVar63 = dVar64 * dVar89 - dVar75 * dVar62;
                              dVar72 = dVar75 * dVar7 - dVar70 * dVar89;
                              dVar83 = dVar7 * dVar80 - dVar98 * dVar89;
                              dStack_200 = auVar27._8_8_;
                              auVar79._8_4_ = SUB84(dVar72,0);
                              auVar79._0_8_ = dVar63;
                              auVar79._12_4_ = (int)((ulong)dVar72 >> 0x20);
                              dVar93 = dVar50 * dVar63 +
                                       dVar48 * (dVar64 * dVar80 - dVar75 * dVar76) +
                                       dVar28 * (dVar64 - dVar75) +
                                       dVar69 * (dVar89 * dVar76 - dVar80 * dVar62) +
                                       dVar71 * (dVar62 - dVar89) + dVar82 * dVar92;
                              dVar96 = dVar50 * dVar72 +
                                       dVar48 * dVar58 +
                                       dStack_200 * dVar56 +
                                       dVar69 * dVar83 + dVar71 * dVar57 + dVar82 * dVar52;
                              dVar63 = dVar7 - dVar62;
                              dVar88 = dVar70 - dVar64;
                              dVar72 = dVar50 * dVar54 +
                                       dVar48 * dVar53 +
                                       dVar28 * dVar88 +
                                       dVar69 * dVar81 + dVar71 * dVar63 + dVar82 * dVar95;
                              auVar77._8_8_ = -(ulong)(ABS(dVar96) < 2.220446049250313e-16);
                              auVar77._0_8_ = -(ulong)(ABS(dVar93) < 2.220446049250313e-16);
                              uVar59 = movmskpd((int)pdVar42,auVar77);
                              bVar46 = (byte)uVar59;
                              dVar74 = ABS(dVar72);
                              bVar41 = dVar74 < 2.220446049250313e-16 & bVar46 >> 1;
                              dStack_340 = auVar22._8_8_;
                              if (((uVar59 & 1) == 0) || (bVar41 == 0)) {
                                dVar70 = -dVar62;
                                dStack_330 = auVar79._8_8_;
                                if ((0.0 <= dVar72) || ((0.0 <= dVar93 || (0.0 <= dVar96)))) {
                                  auVar17._8_8_ = -(ulong)(0.0 < dVar96);
                                  auVar17._0_8_ = -(ulong)(0.0 < dVar93);
                                  iVar44 = movmskpd(in_R11D,auVar17);
                                  uVar45 = (undefined3)((uint)iVar44 >> 8);
                                  in_R11D = CONCAT31(uVar45,iVar44 == 3);
                                  if (((0.0 < dVar72) && (iVar44 == 3)) ||
                                     (((bVar47 = 0.0 < dVar96 * dVar72,
                                       in_R11D = CONCAT31(uVar45,bVar47), (bVar46 & bVar47) != 0 ||
                                       (bVar47 = 0.0 < dVar72 * dVar93,
                                       in_R11D = CONCAT31(uVar45,bVar47),
                                       (bVar46 >> 1 & bVar47) != 0)) ||
                                      ((dVar74 < 2.220446049250313e-16 && (0.0 < dVar96 * dVar93))))
                                     )) goto LAB_00739d21;
                                  if ((uVar59 & 1) == 0) {
                                    if (bVar41 != 0) goto LAB_00739fda;
                                    goto LAB_00739e48;
                                  }
                                  if (bVar46 >> 1 == 0) {
                                    if (dVar74 < 2.220446049250313e-16) {
                                      dStack_2b0 = auVar66._8_8_;
                                      dStack_2d0 = auVar65._8_8_;
                                      if (0.0 < (dVar95 * (dVar29 * dVar89 + dVar75 * dStack_2d0) +
                                                dVar63 * (dVar29 * dVar80 + dStack_2b0 * dVar75) +
                                                dVar81 * (dVar29 - dVar75) +
                                                dVar88 * (dVar26 * dVar89 + dStack_2d0 * dVar80) +
                                                dVar53 * (dVar21 - dVar89) +
                                                dVar54 * (dVar80 - dVar26)) *
                                                (dVar95 * (dVar75 * local_98 + local_a8 * -dVar89) +
                                                dVar63 * (dVar75 * dStack_a0 + -dVar80 * local_a8) +
                                                dVar81 * (dVar75 - local_a8) +
                                                dVar88 * (dVar80 * local_98 + -dVar89 * dStack_a0) +
                                                dVar53 * (dVar89 - local_98) +
                                                dVar54 * (dStack_a0 - dVar80))) goto LAB_00739e32;
                                    }
                                    goto LAB_00739e48;
                                  }
LAB_00739fda:
                                  dVar64 = (dVar52 * (dVar29 * dVar62 + dVar64 * auVar65._0_8_) +
                                           dVar57 * (dVar29 * dVar76 + auVar66._0_8_ * dVar64) +
                                           dVar83 * (dVar29 - dVar64) +
                                           dVar56 * (dVar26 * dVar62 + auVar65._0_8_ * dVar76) +
                                           dVar58 * (dVar21 - dVar62) +
                                           dStack_330 * (dVar76 - dVar26)) *
                                           (dVar52 * (dVar64 * local_98 + local_a8 * dVar70) +
                                           dVar57 * (dVar64 * dStack_a0 + -dVar76 * local_a8) +
                                           dVar83 * (dVar64 - local_a8) +
                                           dVar56 * (dVar76 * local_98 + dVar70 * dStack_a0) +
                                           dVar58 * (dVar62 - local_98) +
                                           dStack_330 * (dStack_a0 - dVar76));
                                }
                                else {
LAB_00739d21:
                                  dVar64 = (dVar52 * (local_a8 * dVar62 + dVar64 * dVar25) +
                                           dVar57 * (local_a8 * dVar76 + dVar90 * dVar64) +
                                           dVar83 * (local_a8 - dVar64) +
                                           dVar56 * (dStack_340 * dVar62 + dVar25 * dVar76) +
                                           dVar58 * (local_98 - dVar62) +
                                           dStack_330 * (dVar76 - dStack_340)) *
                                           (dVar52 * (dVar64 * dVar21 + dVar29 * dVar70) +
                                           dVar57 * (dVar64 * dVar26 + -dVar76 * dVar29) +
                                           dVar83 * (dVar64 - dVar29) +
                                           dVar56 * (dVar76 * dVar21 + dVar70 * dVar26) +
                                           dVar58 * (dVar62 - dVar21) +
                                           dStack_330 * (dVar26 - dVar76));
                                }
                                if (dVar64 <= 0.0) goto LAB_00739e48;
                              }
                              else {
                                dVar94 = dVar75 - dVar64;
                                dVar97 = dVar64 - dVar70;
                                dVar93 = dVar89 - dVar62;
                                dVar84 = dVar62 - dVar7;
                                dStack_420 = auVar68._8_8_;
                                dStack_270 = auVar20._8_8_;
                                dVar57 = dVar70 - dVar75;
                                dVar72 = dVar7 - dVar89;
                                dVar81 = dVar94 * (dStack_a0 - dVar76) +
                                         -dVar92 * (local_a8 - dVar64);
                                dVar83 = dVar57 * (dStack_a0 - dVar80) +
                                         -dVar52 * (local_a8 - dStack_420);
                                dVar53 = dVar92 * (local_98 - dVar62) +
                                         -dVar93 * (dStack_a0 - dVar76);
                                dVar54 = dVar52 * (dStack_270 - dVar89) +
                                         -dVar72 * (dStack_a0 - dVar80);
                                auVar78._0_8_ = -dVar94 * (local_98 - dVar62);
                                auVar78._8_8_ = -dVar57 * (dStack_270 - dVar89);
                                dVar86 = dVar93 * (local_a8 - dVar64) + auVar78._0_8_;
                                dVar87 = dVar72 * (local_a8 - dStack_420) + auVar78._8_8_;
                                dVar58 = dVar92 * dVar63 - (dVar98 - dVar76) * dVar93;
                                dVar74 = dVar95 * (local_98 - dVar7) -
                                         (dStack_340 - dVar98) * dVar84;
                                dVar96 = dVar93 * dVar88 - dVar63 * dVar94;
                                dVar85 = dVar84 * (local_a8 - dVar70) - (local_98 - dVar7) * dVar97;
                                dVar63 = dVar94 * (dVar98 - dVar76) - dVar88 * dVar92;
                                dVar56 = dVar97 * (dStack_340 - dVar98) -
                                         (local_a8 - dVar70) * dVar95;
                                auVar18._8_8_ = dVar83 * dVar83 + dVar54 * dVar54 + dVar87 * dVar87;
                                auVar18._0_8_ = dVar81 * dVar81 + dVar53 * dVar53 + dVar86 * dVar86;
                                auVar79 = sqrtpd(auVar78,auVar18);
                                auVar67._0_8_ = dVar63 * dVar63 + dVar58 * dVar58 + dVar96 * dVar96;
                                auVar67._8_8_ = dVar56 * dVar56 + dVar74 * dVar74 + dVar85 * dVar85;
                                auVar68 = sqrtpd(auVar67,auVar67);
                                dVar63 = auVar68._0_8_ * 0.5;
                                if (ABS((auVar68._8_8_ * 0.5 +
                                        auVar79._8_8_ * 0.5 + auVar79._0_8_ * 0.5) - dVar63) <=
                                    2.220446049250313e-16) {
                                  dStack_280 = auVar24._8_8_;
                                  auVar73._0_8_ = dVar29 - dVar64;
                                  auVar73._8_8_ = dVar29 - dVar70;
                                  dStack_290 = auVar23._8_8_;
                                  dVar70 = dVar57 * (dVar26 - dVar80) + -dVar52 * (dVar29 - dVar75);
                                  dVar64 = dVar52 * (dVar21 - dVar89) + (dVar26 - dVar80) * -dVar72;
                                  dVar75 = dVar72 * (dVar29 - dVar75) + (dVar21 - dVar89) * -dVar57;
                                  dVar89 = dVar94 * (dVar26 - dVar76) + -dVar92 * auVar73._0_8_;
                                  dVar72 = dVar97 * (dStack_280 - dVar98) + -dVar95 * auVar73._8_8_;
                                  dVar52 = dVar92 * (dVar21 - dVar62) + (dVar26 - dVar76) * -dVar93;
                                  dVar98 = dVar95 * (dStack_290 - dVar7) +
                                           (dStack_280 - dVar98) * -dVar84;
                                  dVar76 = dVar93 * auVar73._0_8_ + (dVar21 - dVar62) * -dVar94;
                                  dVar80 = dVar84 * auVar73._8_8_ + (dStack_290 - dVar7) * -dVar97;
                                  auVar19._8_8_ =
                                       dVar72 * dVar72 + dVar98 * dVar98 + dVar80 * dVar80;
                                  auVar19._0_8_ =
                                       dVar89 * dVar89 + dVar52 * dVar52 + dVar76 * dVar76;
                                  auVar68 = sqrtpd(auVar73,auVar19);
                                  if (ABS((auVar68._8_8_ * 0.5 +
                                          SQRT(dVar70 * dVar70 + dVar64 * dVar64 + dVar75 * dVar75)
                                          * 0.5 + auVar68._0_8_ * 0.5) - dVar63) <=
                                      2.220446049250313e-16) goto LAB_00739e48;
                                }
                              }
LAB_00739e32:
                              uVar55 = uVar55 + 1;
                            }
                          }
                        }
                      }
                    }
                  }
LAB_00739e48:
                  lVar37 = lVar37 + 0x48;
                } while ((ulong)uVar8 * 0x48 != lVar37);
                lVar37 = (ulong)(uVar55 & 1) * 8 + 200;
              }
              pdVar16[(long)(iVar31 - iVar11) * (iVar36 - lVar33) * lVar34 +
                      (lVar40 - lVar33) * lVar34 + (lVar39 - lVar35)] =
                   *(double *)((long)adStack_108 + lVar37);
              lVar39 = lVar39 + 1;
            } while (iVar38 != (int)lVar39);
          }
          lVar40 = lVar40 + 1;
        } while (iVar36 != (int)lVar40);
      }
      bVar47 = iVar31 != iVar14;
      iVar31 = iVar31 + 1;
    } while (bVar47);
  }
  return;
}

Assistant:

void
STLtools::fillFab (BaseFab<Real>& levelset, const Geometry& geom, RunOn, Box const&) const
{
    int num_triangles = m_num_tri;

    const auto plo = geom.ProbLoArray();
    const auto dx  = geom.CellSizeArray();

    const Triangle* tri_pts = m_tri_pts_d.data();
    XDim3 ptmin = m_ptmin;
    XDim3 ptmax = m_ptmax;
    XDim3 ptref = m_ptref;
    Real reference_value = m_boundry_is_outside ? -1.0_rt :  1.0_rt;
    Real other_value     = m_boundry_is_outside ?  1.0_rt : -1.0_rt;

    auto const& a = levelset.array();
    const Box& bx = levelset.box();
    ParallelFor(bx, [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
    {
        Real coords[3];
        coords[0]=plo[0]+i*dx[0];
        coords[1]=plo[1]+j*dx[1];
#if (AMREX_SPACEDIM == 2)
        coords[2]=Real(0.);
#else
        coords[2]=plo[2]+k*dx[2];
#endif
        int num_intersects=0;
        if (coords[0] >= ptmin.x && coords[0] <= ptmax.x &&
            coords[1] >= ptmin.y && coords[1] <= ptmax.y &&
            coords[2] >= ptmin.z && coords[2] <= ptmax.z)
        {
            Real pr[]={ptref.x, ptref.y, ptref.z};
            for (int tr=0; tr < num_triangles; ++tr) {
                if (line_tri_intersects(pr, coords, tri_pts[tr])) {
                    ++num_intersects;
                }
            }
        }
        a(i,j,k) = (num_intersects % 2 == 0) ? reference_value : other_value;
    });
}